

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::FileDescriptorProto(FileDescriptorProto *this)

{
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffff88;
  InternalMetadataWithArena *in_stack_ffffffffffffff90;
  FileDescriptorProto *this_00;
  
  Message::Message((Message *)in_stack_ffffffffffffff90);
  *in_RDI = &PTR__FileDescriptorProto_009580f0;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  memset(in_RDI + 2,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x4fde32);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x4fde45);
  RepeatedPtrField<google::protobuf::DescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)0x4fde5a);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)0x4fde6f);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)0x4fde84);
  this_00 = (FileDescriptorProto *)(in_RDI + 0xf);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)0x4fde99);
  RepeatedField<int>::RepeatedField((RepeatedField<int> *)(in_RDI + 0x12));
  RepeatedField<int>::RepeatedField((RepeatedField<int> *)(in_RDI + 0x14));
  SharedCtor(this_00);
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.FileDescriptorProto)
}